

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_Constractor5_Test::TestBody(ConfidentialTxOut_Constractor5_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertHelper local_778;
  Message local_770;
  int local_764;
  int64_t local_760;
  undefined1 local_758;
  Amount local_750;
  int64_t local_740;
  undefined1 local_738 [8];
  AssertionResult gtest_ar_6;
  Message local_720;
  ByteData local_718;
  string local_700;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_5;
  Message local_6c8;
  ByteData local_6c0;
  string local_6a8;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_4;
  Message local_670;
  ConfidentialNonce local_668;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_3;
  Message local_608;
  Script local_600;
  string local_5c8;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_2;
  Message local_590;
  int64_t local_588;
  int64_t local_580;
  undefined1 local_578;
  ConfidentialValue local_570;
  Amount local_548;
  int64_t local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_1;
  Message local_518;
  string local_510;
  ConfidentialAssetId local_4f0;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_318 [8];
  ConfidentialTxOut txout;
  undefined1 local_210 [8];
  Amount amount;
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  ElementsConfidentialAddress address;
  ConfidentialTxOut_Constractor5_Test *this_local;
  
  address.address_.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,&local_1e9);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  txout.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)AVar3.amount_;
  amount.amount_._0_1_ = AVar3.ignore_check_;
  local_210 = (undefined1  [8])
              txout.range_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            ((Address *)&gtest_ar.message_,(ElementsConfidentialAddress *)local_1c8);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_318,(Address *)&gtest_ar.message_,&exp_asset,
             (Amount *)local_210);
  cfd::core::Address::~Address((Address *)&gtest_ar.message_);
  cfd::core::ConfidentialTxOut::GetAsset(&local_4f0,(ConfidentialTxOut *)local_318);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4c8,&local_4f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_510,&exp_asset);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4a8,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4c8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  cfd::core::ConfidentialTxOut::GetConfidentialValue(&local_570,(ConfidentialTxOut *)local_318);
  AVar3 = cfd::core::ConfidentialValue::GetAmount(&local_570);
  local_580 = AVar3.amount_;
  local_578 = AVar3.ignore_check_;
  local_548.amount_ = local_580;
  local_548.ignore_check_ = (bool)local_578;
  local_538 = cfd::core::Amount::GetSatoshiValue(&local_548);
  local_588 = cfd::core::Amount::GetSatoshiValue((Amount *)local_210);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_530,
             "txout.GetConfidentialValue().GetAmount().GetSatoshiValue()","amount.GetSatoshiValue()"
             ,&local_538,&local_588);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_570);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  cfd::core::AbstractTxOut::GetLockingScript(&local_600,(AbstractTxOut *)local_318);
  cfd::core::Script::GetHex_abi_cxx11_(&local_5c8,&local_600);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5a8,"txout.GetLockingScript().GetHex().c_str()",
             "\"0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",pcVar2,
             "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  std::__cxx11::string::~string((string *)&local_5c8);
  cfd::core::Script::~Script(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  cfd::core::ConfidentialTxOut::GetNonce(&local_668,(ConfidentialTxOut *)local_318);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_640,&local_668);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_620,"txout.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_640);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  cfd::core::ConfidentialTxOut::GetRangeProof(&local_6c0,(ConfidentialTxOut *)local_318);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_6a8,&local_6c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_688,"txout.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_6a8);
  cfd::core::ByteData::~ByteData(&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  cfd::core::ConfidentialTxOut::GetSurjectionProof(&local_718,(ConfidentialTxOut *)local_318);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_700,&local_718);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6e0,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_700);
  cfd::core::ByteData::~ByteData(&local_718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  AVar3 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)local_318);
  local_760 = AVar3.amount_;
  local_758 = AVar3.ignore_check_;
  local_750.amount_ = local_760;
  local_750.ignore_check_ = (bool)local_758;
  local_740 = cfd::core::Amount::GetSatoshiValue(&local_750);
  local_764 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_738,"txout.GetValue().GetSatoshiValue()","0",&local_740,
             &local_764);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_778,&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_318);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1c8);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor5) {
  // ConfidentialAssetId, ConfidentialValue
  ElementsConfidentialAddress address("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz");
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(address.GetUnblindedAddress(), exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
      "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}